

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O1

ostream * lest::operator<<(ostream *os,optional<char> *v)

{
  bool bVar1;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *chr;
  string local_80;
  char *local_60;
  long local_58;
  char local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  long local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[optional:",10);
  bVar1 = v->has_value_;
  if (bVar1 == true) {
    to_string_abi_cxx11_(&local_80,(lest *)&(v->contained).data,chr);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
  }
  else {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"[empty]","");
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_40,local_40->_M_local_buf + local_38);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  paVar3 = &local_80.field_2;
  if (bVar1 == false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    paVar3 = &local_30;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}